

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

uint16_t basist::dxt1_block::pack_color(color32 *color,bool scaled,uint32_t bias)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int in_EDX;
  byte in_SIL;
  byte *in_RDI;
  uint32_t b;
  uint32_t g;
  uint32_t r;
  uint local_1c;
  uint local_18;
  uint local_14;
  
  local_14 = (uint)*in_RDI;
  local_18 = (uint)in_RDI[1];
  local_1c = (uint)in_RDI[2];
  if ((in_SIL & 1) != 0) {
    local_14 = (local_14 * 0x1f + in_EDX) / 0xff;
    local_18 = (local_18 * 0x3f + in_EDX) / 0xff;
    local_1c = (local_1c * 0x1f + in_EDX) / 0xff;
  }
  uVar1 = basisu::minimum<unsigned_int>(local_1c,0x1f);
  uVar2 = basisu::minimum<unsigned_int>(local_18,0x3f);
  uVar3 = basisu::minimum<unsigned_int>(local_14,0x1f);
  return (ushort)uVar1 | (ushort)(uVar2 << 5) | (ushort)(uVar3 << 0xb);
}

Assistant:

static uint16_t pack_color(const color32& color, bool scaled, uint32_t bias = 127U)
		{
			uint32_t r = color.r, g = color.g, b = color.b;
			if (scaled)
			{
				r = (r * 31U + bias) / 255U;
				g = (g * 63U + bias) / 255U;
				b = (b * 31U + bias) / 255U;
			}
			return static_cast<uint16_t>(basisu::minimum(b, 31U) | (basisu::minimum(g, 63U) << 5U) | (basisu::minimum(r, 31U) << 11U));
		}